

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Polyobj_MoveToSpot
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  AActor *pAVar2;
  DVector2 local_18;
  
  if (arg2 != 0) {
    for (pAVar2 = AActor::TIDHash[arg2 & 0x7f]; pAVar2 != (AActor *)0x0; pAVar2 = pAVar2->inext) {
      if (pAVar2->tid == arg2) {
        local_18.X = (pAVar2->__Pos).X;
        local_18.Y = (pAVar2->__Pos).Y;
        bVar1 = EV_MovePolyTo((line_t_conflict *)ln,arg0,(double)arg1 * 0.125,&local_18,false);
        return (uint)bVar1;
      }
    }
  }
  return 0;
}

Assistant:

FUNC(LS_Polyobj_MoveToSpot)
// Polyobj_MoveToSpot (po, speed, tid)
{
	FActorIterator iterator (arg2);
	AActor *spot = iterator.Next();
	if (spot == NULL) return false;
	return EV_MovePolyTo (ln, arg0, SPEED(arg1), spot->Pos(), false);
}